

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type * __thiscall
FadBinaryAdd<Fad<Fad<double>_>,_FadCst<double>_>::dx
          (value_type *__return_storage_ptr__,FadBinaryAdd<Fad<Fad<double>_>,_FadCst<double>_> *this
          ,int i)

{
  uint uVar1;
  Fad<Fad<double>_> *pFVar2;
  MEM_CPY<double> *this_00;
  ulong uVar3;
  Fad<double> *pFVar4;
  
  pFVar2 = this->left_;
  pFVar4 = &pFVar2->defaultVal;
  if ((pFVar2->dx_).num_elts != 0) {
    pFVar4 = (pFVar2->dx_).ptr_to_data + i;
  }
  __return_storage_ptr__->val_ = pFVar4->val_;
  uVar1 = (pFVar4->dx_).num_elts;
  (__return_storage_ptr__->dx_).num_elts = uVar1;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if ((long)(int)uVar1 != 0) {
    uVar3 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar3 = (long)(int)uVar1 << 3;
    }
    this_00 = (MEM_CPY<double> *)operator_new__(uVar3);
    (__return_storage_ptr__->dx_).ptr_to_data = (double *)this_00;
    MEM_CPY<double>::copy
              (this_00,(EVP_PKEY_CTX *)(pFVar4->dx_).ptr_to_data,(EVP_PKEY_CTX *)(ulong)uVar1);
  }
  __return_storage_ptr__->defaultVal = pFVar4->defaultVal;
  return __return_storage_ptr__;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i);}